

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall
BackwardPass::NeedBailOutOnImplicitCallsForTypedArrayStore(BackwardPass *this,Instr *instr)

{
  Opnd *pOVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  undefined8 uStack_28;
  
  if ((instr->m_opcode == StElemI_A_Strict) || (instr->m_opcode == StElemI_A)) {
    uStack_28 = in_RAX;
    OVar3 = IR::Opnd::GetKind(instr->m_dst);
    if (OVar3 == OpndKindIndir) {
      pOVar1 = instr->m_dst;
      OVar3 = IR::Opnd::GetKind(pOVar1);
      if (OVar3 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar4) goto LAB_003e0319;
        *puVar6 = 0;
      }
      uStack_28._0_6_ = CONCAT24(*(undefined2 *)(pOVar1[1]._vptr_Opnd + 1),(undefined4)uStack_28);
      bVar4 = ValueType::IsLikelyTypedArray((ValueType *)((long)&uStack_28 + 4));
      if (bVar4) {
        pOVar1 = instr->m_src1;
        OVar3 = IR::Opnd::GetKind(pOVar1);
        if (OVar3 == OpndKindReg) {
          OVar5 = IR::Opnd::GetKind(pOVar1);
          if (OVar5 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar4) goto LAB_003e0319;
            *puVar6 = 0;
          }
          uStack_28 = CONCAT26((pOVar1->m_valueType).field_0.bits,(undefined6)uStack_28);
          bVar4 = ValueType::IsPrimitive((ValueType *)((long)&uStack_28 + 6));
          if (!bVar4) {
            OVar5 = IR::Opnd::GetKind(pOVar1);
            if (OVar5 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar6 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar4) goto LAB_003e0319;
              *puVar6 = 0;
            }
            if (*(char *)((long)pOVar1[1]._vptr_Opnd + 0x1c) != '\x03') {
              OVar5 = IR::Opnd::GetKind(pOVar1);
              if (OVar5 != OpndKindReg) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar6 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                if (!bVar4) {
LAB_003e0319:
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *puVar6 = 0;
              }
              if (*(char *)((long)pOVar1[1]._vptr_Opnd + 0x1c) != '\n') {
                pRVar7 = IR::Opnd::AsRegOpnd(pOVar1);
                bVar4 = StackSym::IsFloatConst(pRVar7->m_sym);
                if (!bVar4) {
                  pRVar7 = IR::Opnd::AsRegOpnd(pOVar1);
                  bVar4 = StackSym::IsIntConst(pRVar7->m_sym);
                  OVar5 = !bVar4;
                  goto LAB_003e0305;
                }
              }
            }
          }
          OVar5 = OpndKindInvalid;
        }
        else {
          OVar5 = IR::Opnd::GetKind(pOVar1);
          if (OVar5 != OpndKindIntConst) {
            OVar5 = IR::Opnd::GetKind(pOVar1);
            if (OVar5 != OpndKindInt64Const) {
              OVar5 = IR::Opnd::GetKind(pOVar1);
              if (OVar5 != OpndKindFloat32Const) {
                OVar5 = IR::Opnd::GetKind(pOVar1);
                if (OVar5 != OpndKindFloatConst) {
                  OVar5 = IR::Opnd::GetKind(pOVar1);
                  if (OVar5 != OpndKindAddr) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                    *puVar6 = 1;
                    OVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0xa0f,
                                       "(opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd())"
                                       ,
                                       "opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd()"
                                      );
                    if (!(bool)OVar5) goto LAB_003e0319;
                    *puVar6 = 0;
                  }
                }
              }
            }
          }
        }
LAB_003e0305:
        if (OVar3 == OpndKindReg) goto LAB_003e030c;
      }
    }
  }
  OVar5 = OpndKindInvalid;
LAB_003e030c:
  return (bool)(OVar5 & OpndKindIntConst);
}

Assistant:

bool
BackwardPass::NeedBailOutOnImplicitCallsForTypedArrayStore(IR::Instr* instr)
{
    if ((instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict) &&
        instr->GetDst()->IsIndirOpnd() &&
        instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyTypedArray())
    {
        IR::Opnd * opnd = instr->GetSrc1();
        if (opnd->IsRegOpnd())
        {
            return !opnd->AsRegOpnd()->GetValueType().IsPrimitive() &&
                !opnd->AsRegOpnd()->m_sym->IsInt32() &&
                !opnd->AsRegOpnd()->m_sym->IsFloat64() &&
                !opnd->AsRegOpnd()->m_sym->IsFloatConst() &&
                !opnd->AsRegOpnd()->m_sym->IsIntConst();
        }
        else
        {
            Assert(opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd() || opnd->IsFloat32ConstOpnd() || opnd->IsFloatConstOpnd() || opnd->IsAddrOpnd());
        }
    }
    return false;
}